

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O1

int run_test_semaphore_3(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_sem_t *loop;
  uv_loop_t *puVar2;
  uv_sem_t *unaff_RBX;
  int iVar3;
  uv_tcp_t *puVar4;
  uv_pipe_t *handle;
  uv_connect_t *loop_00;
  uv_sem_t sem;
  uv_pipe_t uStack_258;
  uv_loop_t *puStack_150;
  code *pcStack_148;
  sockaddr_in sStack_138;
  uv_tcp_t uStack_128;
  uv_loop_t *puStack_30;
  uv_sem_t uStack_28;
  
  loop = &uStack_28;
  puStack_30 = (uv_loop_t *)0x167be2;
  iVar1 = uv_sem_init(&uStack_28,3);
  if (iVar1 == 0) {
    puStack_30 = (uv_loop_t *)0x167bf1;
    uv_sem_wait(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167bf9;
    uv_sem_wait(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167c01;
    iVar1 = uv_sem_trywait(&uStack_28);
    unaff_RBX = &uStack_28;
    if (iVar1 != 0) goto LAB_00167c4b;
    puStack_30 = (uv_loop_t *)0x167c0d;
    iVar1 = uv_sem_trywait(&uStack_28);
    unaff_RBX = &uStack_28;
    if (iVar1 != -0xb) goto LAB_00167c50;
    puStack_30 = (uv_loop_t *)0x167c1d;
    uv_sem_post(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167c25;
    iVar1 = uv_sem_trywait(&uStack_28);
    if (iVar1 != 0) goto LAB_00167c55;
    puStack_30 = (uv_loop_t *)0x167c31;
    iVar1 = uv_sem_trywait(&uStack_28);
    loop = &uStack_28;
    if (iVar1 == -0xb) {
      puStack_30 = (uv_loop_t *)0x167c3e;
      uv_sem_destroy(&uStack_28);
      return 0;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x167c4b;
    run_test_semaphore_3_cold_1();
LAB_00167c4b:
    puStack_30 = (uv_loop_t *)0x167c50;
    run_test_semaphore_3_cold_2();
LAB_00167c50:
    loop = unaff_RBX;
    puStack_30 = (uv_loop_t *)0x167c55;
    run_test_semaphore_3_cold_3();
LAB_00167c55:
    puStack_30 = (uv_loop_t *)0x167c5a;
    run_test_semaphore_3_cold_4();
  }
  puStack_30 = (uv_loop_t *)0x167c5f;
  run_test_semaphore_3_cold_5();
  loop_00 = (uv_connect_t *)0x1a4b5a;
  iVar3 = 0x23a3;
  pcStack_148 = (code *)0x167c7e;
  puStack_30 = (uv_loop_t *)loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_138);
  if (iVar1 == 0) {
    pcStack_148 = (code *)0x167c8b;
    loop_00 = (uv_connect_t *)uv_default_loop();
    puVar4 = &uStack_128;
    pcStack_148 = (code *)0x167c98;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,puVar4);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167d33;
    loop_00 = &connect_req;
    puVar4 = &uStack_128;
    pcStack_148 = (code *)0x167cbd;
    iVar1 = uv_tcp_connect(&connect_req,puVar4,(sockaddr *)&sStack_138,connect_cb);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167d38;
    pcStack_148 = (code *)0x167cc6;
    loop_00 = (uv_connect_t *)uv_default_loop();
    iVar3 = 0;
    pcStack_148 = (code *)0x167cd0;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167d3d;
    if (connect_cb_called != 1) goto LAB_00167d42;
    if (shutdown_cb_called != 1) goto LAB_00167d47;
    if (close_cb_called != 1) goto LAB_00167d4c;
    pcStack_148 = (code *)0x167cf4;
    loop = (uv_sem_t *)uv_default_loop();
    pcStack_148 = (code *)0x167d08;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    pcStack_148 = (code *)0x167d12;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    pcStack_148 = (code *)0x167d17;
    loop_00 = (uv_connect_t *)uv_default_loop();
    pcStack_148 = (code *)0x167d1f;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_148 = (code *)0x167d33;
    run_test_shutdown_close_tcp_cold_1();
LAB_00167d33:
    pcStack_148 = (code *)0x167d38;
    run_test_shutdown_close_tcp_cold_2();
LAB_00167d38:
    pcStack_148 = (code *)0x167d3d;
    run_test_shutdown_close_tcp_cold_3();
LAB_00167d3d:
    pcStack_148 = (code *)0x167d42;
    run_test_shutdown_close_tcp_cold_4();
LAB_00167d42:
    pcStack_148 = (code *)0x167d47;
    run_test_shutdown_close_tcp_cold_5();
LAB_00167d47:
    pcStack_148 = (code *)0x167d4c;
    run_test_shutdown_close_tcp_cold_6();
LAB_00167d4c:
    pcStack_148 = (code *)0x167d51;
    run_test_shutdown_close_tcp_cold_7();
  }
  pcStack_148 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (loop_00 == &connect_req) {
    if (iVar3 != 0) goto LAB_00167dc6;
    puStack_150 = (uv_loop_t *)0x167d81;
    pcStack_148._0_4_ = extraout_EAX;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    if (iVar1 != 0) goto LAB_00167dcb;
    puStack_150 = (uv_loop_t *)0x167d91;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 != 0) goto LAB_00167dd0;
    puStack_150 = (uv_loop_t *)0x167da8;
    uv_close((uv_handle_t *)connect_req.handle,close_cb);
    puStack_150 = (uv_loop_t *)0x167db4;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 == 1) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_148;
    }
  }
  else {
    puStack_150 = (uv_loop_t *)0x167dc6;
    connect_cb_cold_1();
LAB_00167dc6:
    puStack_150 = (uv_loop_t *)0x167dcb;
    connect_cb_cold_2();
LAB_00167dcb:
    puStack_150 = (uv_loop_t *)0x167dd0;
    connect_cb_cold_3();
LAB_00167dd0:
    puStack_150 = (uv_loop_t *)0x167dd5;
    connect_cb_cold_4();
  }
  puStack_150 = (uv_loop_t *)run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  puStack_150 = (uv_loop_t *)loop;
  puVar2 = uv_default_loop();
  handle = &uStack_258;
  iVar1 = uv_pipe_init(puVar2,handle,0);
  iVar3 = (int)handle;
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,&uStack_258,"/tmp/uv-test-sock",connect_cb);
    puVar2 = uv_default_loop();
    iVar3 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167e8f;
    if (connect_cb_called != 1) goto LAB_00167e94;
    if (shutdown_cb_called != 1) goto LAB_00167e99;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00167ea3;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_00167e8f:
    run_test_shutdown_close_pipe_cold_2();
LAB_00167e94:
    run_test_shutdown_close_pipe_cold_3();
LAB_00167e99:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_00167ea3:
  run_test_shutdown_close_pipe_cold_6();
  if (puVar2 == (uv_loop_t *)&shutdown_req) {
    if ((iVar3 == -0x7d) || (iVar3 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT(0 == uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}